

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::isListening(FileServer *this)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  bVar1 = ((this->m_impl)._M_t.
           super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
           .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->isListening;
  pthread_mutex_unlock(__mutex);
  return bVar1;
}

Assistant:

bool FileServer::isListening() {
    std::lock_guard<std::mutex> lock(m_impl->mutex);
    return m_impl->isListening;
}